

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O0

bool __thiscall cmFileCopier::Install(cmFileCopier *this,char *fromFile,char *toFile)

{
  cmCommand *this_00;
  bool bVar1;
  int iVar2;
  allocator local_271;
  string local_270;
  allocator local_249;
  string local_248;
  allocator local_221;
  string local_220;
  allocator local_1f9;
  string local_1f8;
  MatchProperties local_1d8;
  MatchProperties match_properties;
  ostringstream local_1a0 [8];
  ostringstream e;
  char *toFile_local;
  char *fromFile_local;
  cmFileCopier *this_local;
  
  if (*fromFile == '\0') {
    std::__cxx11::ostringstream::ostringstream(local_1a0);
    std::operator<<((ostream *)local_1a0,"INSTALL encountered an empty string input file name.");
    this_00 = &this->FileCommand->super_cmCommand;
    std::__cxx11::ostringstream::str();
    cmCommand::SetError(this_00,(string *)&match_properties);
    std::__cxx11::string::~string((string *)&match_properties);
    this_local._7_1_ = false;
    std::__cxx11::ostringstream::~ostringstream(local_1a0);
  }
  else {
    local_1d8 = CollectMatchProperties(this,fromFile);
    if (((ulong)local_1d8 & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_1f8,fromFile,&local_1f9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_220,toFile,&local_221);
      bVar1 = cmsys::SystemTools::SameFile(&local_1f8,&local_220);
      std::__cxx11::string::~string((string *)&local_220);
      std::allocator<char>::~allocator((allocator<char> *)&local_221);
      std::__cxx11::string::~string((string *)&local_1f8);
      std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
      if (bVar1) {
        this_local._7_1_ = true;
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_248,fromFile,&local_249);
        bVar1 = cmsys::SystemTools::FileIsSymlink(&local_248);
        std::__cxx11::string::~string((string *)&local_248);
        std::allocator<char>::~allocator((allocator<char> *)&local_249);
        if (bVar1) {
          this_local._7_1_ = InstallSymlink(this,fromFile,toFile);
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_270,fromFile,&local_271);
          bVar1 = cmsys::SystemTools::FileIsDirectory(&local_270);
          std::__cxx11::string::~string((string *)&local_270);
          std::allocator<char>::~allocator((allocator<char> *)&local_271);
          if (bVar1) {
            this_local._7_1_ = InstallDirectory(this,fromFile,toFile,&local_1d8);
          }
          else {
            bVar1 = cmsys::SystemTools::FileExists(fromFile);
            if (bVar1) {
              this_local._7_1_ = InstallFile(this,fromFile,toFile,&local_1d8);
            }
            else {
              iVar2 = (*this->_vptr_cmFileCopier[5])(this,fromFile);
              this_local._7_1_ = (bool)((byte)iVar2 & 1);
            }
          }
        }
      }
    }
    else {
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool cmFileCopier::Install(const char* fromFile, const char* toFile)
{
  if(!*fromFile)
    {
    std::ostringstream e;
    e << "INSTALL encountered an empty string input file name.";
    this->FileCommand->SetError(e.str());
    return false;
    }

  // Collect any properties matching this file name.
  MatchProperties match_properties = this->CollectMatchProperties(fromFile);

  // Skip the file if it is excluded.
  if(match_properties.Exclude)
    {
    return true;
    }

  if(cmSystemTools::SameFile(fromFile, toFile))
    {
    return true;
    }
  else if(cmSystemTools::FileIsSymlink(fromFile))
    {
    return this->InstallSymlink(fromFile, toFile);
    }
  else if(cmSystemTools::FileIsDirectory(fromFile))
    {
    return this->InstallDirectory(fromFile, toFile, match_properties);
    }
  else if(cmSystemTools::FileExists(fromFile))
    {
    return this->InstallFile(fromFile, toFile, match_properties);
    }
  return this->ReportMissing(fromFile);
}